

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_highbd_convolve_2d_sr_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  ushort uVar1;
  ushort uVar2;
  int16_t *piVar3;
  byte bVar4;
  uint16_t uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  short *psVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  int k;
  int iVar18;
  ulong uVar19;
  long lVar20;
  short *psVar21;
  short *psVar22;
  uint local_8b50;
  int16_t im_block [17792];
  
  uVar1 = filter_params_y->taps;
  iVar12 = (uVar1 >> 1) - 1;
  uVar2 = filter_params_x->taps;
  piVar3 = filter_params_x->filter_ptr;
  bVar9 = (byte)conv_params->round_0;
  uVar14 = 0;
  if (0 < w) {
    uVar14 = (ulong)(uint)w;
  }
  uVar17 = (h + (uint)uVar1) - 1;
  uVar7 = (ulong)uVar17;
  if ((int)uVar17 < 1) {
    uVar7 = 0;
  }
  iVar18 = 1 - (uint)(uVar2 >> 1);
  lVar20 = (long)w;
  bVar4 = (byte)conv_params->round_1;
  for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
    iVar13 = iVar18;
    for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
      iVar15 = 1 << ((char)bd + 6U & 0x1f);
      for (uVar19 = 0; uVar2 != uVar19; uVar19 = uVar19 + 1) {
        iVar15 = iVar15 + (uint)src[((long)iVar13 + uVar19) - (long)(iVar12 * src_stride)] *
                          (int)*(short *)((long)piVar3 +
                                         uVar19 * 2 +
                                         (ulong)((subpel_x_qn & 0xfU) * (uint)uVar2 * 2));
      }
      im_block[uVar16 + uVar6 * lVar20] =
           (int16_t)(iVar15 + ((1 << (bVar9 & 0x1f)) >> 1) >> (bVar9 & 0x1f));
      iVar13 = iVar13 + 1;
    }
    iVar18 = iVar18 + src_stride;
  }
  bVar8 = 0xe - (bVar4 + bVar9);
  local_8b50 = (uint)uVar1;
  bVar9 = ((char)bd - bVar9) + 0xe;
  piVar3 = filter_params_y->filter_ptr;
  bVar10 = bVar9 - bVar4;
  uVar6 = 0;
  uVar7 = (ulong)(uint)h;
  if (h < 1) {
    uVar7 = uVar6;
  }
  psVar21 = im_block + (1 - (ulong)(uVar1 >> 1)) * lVar20 + (long)(iVar12 * w);
  for (; uVar6 != uVar7; uVar6 = uVar6 + 1) {
    psVar22 = psVar21;
    for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
      psVar11 = psVar22;
      iVar12 = 1 << (bVar9 & 0x1f);
      for (uVar19 = 0; filter_params_y->taps != uVar19; uVar19 = uVar19 + 1) {
        iVar12 = iVar12 + (int)*psVar11 *
                          (int)*(short *)((long)piVar3 +
                                         uVar19 * 2 + (ulong)((subpel_y_qn & 0xfU) * local_8b50 * 2)
                                         );
        psVar11 = psVar11 + lVar20;
      }
      uVar5 = clip_pixel_highbd((iVar12 + ((1 << (bVar4 & 0x1f)) >> 1) >> (bVar4 & 0x1f)) +
                                ((1 << (bVar8 & 0x1f)) >> 1) + (-1 << (bVar10 & 0x1f)) +
                                (-1 << (bVar10 - 1 & 0x1f)) >> (bVar8 & 0x1f),bd);
      dst[uVar6 * (long)dst_stride + uVar16] = uVar5;
      psVar22 = psVar22 + 1;
    }
    psVar21 = psVar21 + lVar20;
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_sr_c(const uint16_t *src, int src_stride,
                                 uint16_t *dst, int dst_stride, int w, int h,
                                 const InterpFilterParams *filter_params_x,
                                 const InterpFilterParams *filter_params_y,
                                 const int subpel_x_qn, const int subpel_y_qn,
                                 ConvolveParams *conv_params, int bd) {
  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = w;
  assert(w <= MAX_SB_SIZE && h <= MAX_SB_SIZE);
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  assert(bits >= 0);

  // horizontal filter
  const uint16_t *src_horiz = src - fo_vert * src_stride;
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < im_h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_horiz[y * src_stride + x - fo_horiz + k];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      im_block[y * im_stride + x] =
          ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_vert[(y - fo_vert + k) * im_stride + x];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      int32_t res = ROUND_POWER_OF_TWO(sum, conv_params->round_1) -
                    ((1 << (offset_bits - conv_params->round_1)) +
                     (1 << (offset_bits - conv_params->round_1 - 1)));
      dst[y * dst_stride + x] =
          clip_pixel_highbd(ROUND_POWER_OF_TWO(res, bits), bd);
    }
  }
}